

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O1

bool vera::loadPLY(string *_filename,Scene *_scene,bool _verbose)

{
  pointer pvVar1;
  pointer *ppvVar2;
  mapped_type pMVar3;
  vec<2,_float,_(glm::qualifier)0> vVar4;
  Scene *pSVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  iterator iVar10;
  Material *this;
  mapped_type *ppMVar11;
  ostream *poVar12;
  istream *piVar13;
  long lVar14;
  undefined8 extraout_RAX;
  Model *this_00;
  mapped_type *ppMVar15;
  long *plVar16;
  char *pcVar17;
  size_type *psVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  byte bVar22;
  bool bVar23;
  int colorCompsFound;
  int normalsCoordsFound;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vec3 n;
  float a;
  vec3 v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float b;
  float g;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string error;
  string line;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  string name;
  stringstream sline;
  Mesh mesh;
  fstream is;
  int local_608;
  int local_604;
  uint local_600;
  int local_5fc;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_5f8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_5e0;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_5dc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_5d8;
  undefined4 uStack_5d4;
  undefined1 local_5d0 [20];
  float local_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_598;
  ulong local_578;
  long local_570;
  ulong local_568;
  ulong local_560;
  MaterialsMap *local_558;
  float local_550;
  float local_54c;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_548;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  local_528;
  char *local_508;
  char *local_500;
  char local_4f8 [16];
  ios_base *local_4e8;
  string *local_4e0;
  char *local_4d8;
  long local_4d0;
  char local_4c8 [16];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_4b8;
  string local_4a0;
  mapped_type local_480;
  Scene *local_478;
  undefined1 local_470 [128];
  ios_base local_3f0 [264];
  Mesh local_2e8;
  long local_240 [66];
  
  local_4e0 = _filename;
  std::fstream::fstream(local_240,(_filename->_M_dataplus)._M_p,_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 != '\0') {
    local_470._0_8_ = local_470 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"default","");
    local_558 = &_scene->materials;
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
             ::find(&local_558->_M_t,(key_type *)local_470);
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_);
    }
    if ((_Rb_tree_header *)iVar10._M_node == &(_scene->materials)._M_t._M_impl.super__Rb_tree_header
       ) {
      this = (Material *)operator_new(0x150);
      local_470._0_8_ = local_470 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"default","");
      Material::Material(this,(string *)local_470);
      ppvVar2 = &local_2e8.m_colors.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_2e8._vptr_Mesh = (_func_int **)ppvVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"default","");
      ppMVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](local_558,(key_type *)&local_2e8);
      *ppMVar11 = this;
      if ((pointer *)local_2e8._vptr_Mesh != ppvVar2) {
        operator_delete(local_2e8._vptr_Mesh);
      }
      if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
        operator_delete((void *)local_470._0_8_);
      }
    }
    local_470._0_8_ = local_470 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"default","");
    ppMVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](local_558,(key_type *)local_470);
    pMVar3 = *ppMVar11;
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_);
    }
    Mesh::Mesh(&local_2e8);
    local_4d8 = local_4c8;
    local_4d0 = 0;
    local_4c8[0] = '\0';
    local_508 = local_4f8;
    local_500 = (char *)0x0;
    local_4f8[0] = '\0';
    local_608 = 0;
    local_604 = 0;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    local_4a0._M_string_length = 0;
    local_4a0.field_2._M_local_buf[0] = '\0';
    local_528.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_528.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_528.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_548.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cVar6 = std::ios::widen((char)local_240 + (char)*(undefined8 *)(local_240[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_240,(string *)&local_4d8,cVar6);
    iVar7 = std::__cxx11::string::compare((char *)&local_4d8);
    if (iVar7 == 0) {
      cVar6 = std::ios::widen((char)(istream *)local_240 +
                              (char)*(undefined8 *)(local_240[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_240,(string *)&local_4d8,cVar6);
      iVar7 = std::__cxx11::string::compare((char *)&local_4d8);
      if (iVar7 != 0) {
        iVar7 = 2;
        std::__cxx11::string::_M_replace((ulong)&local_508,0,local_500,0x3204e0);
        goto LAB_002be6ee;
      }
      local_4e8 = local_3f0;
      local_560 = 0;
      iVar9 = -1;
      iVar21 = -1;
      iVar7 = 3;
      iVar20 = -1;
      local_5fc = 0;
      local_568 = 0;
      local_578 = 0;
      local_600 = 0;
      bVar22 = 0;
      local_480 = pMVar3;
      local_478 = _scene;
      while( true ) {
        cVar6 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) + (char)local_240);
        piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_240,(string *)&local_4d8,cVar6);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x32050b,0);
        if (lVar14 != 0) {
          if (((bVar22 & 0xfd) == 0) &&
             (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320513,0), lVar14 == 0)) {
            iVar21 = 0;
            if (0 < iVar20) {
              iVar21 = iVar20;
            }
            std::__cxx11::string::substr((ulong)local_470,(ulong)&local_4d8);
            iVar9 = toInt((string *)local_470);
            std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::resize(&local_5f8,(long)iVar9);
            if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
              operator_delete((void *)local_470._0_8_);
            }
            iVar21 = iVar21 + 1;
            iVar9 = iVar21;
            goto LAB_002beebe;
          }
          if ((bVar22 < 2) &&
             (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320522,0), lVar14 == 0)) {
            iVar20 = 0;
            if (0 < iVar21) {
              iVar20 = iVar21;
            }
            std::__cxx11::string::substr((ulong)local_470,(ulong)&local_4d8);
            iVar8 = toInt((string *)local_470);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_598,(long)(iVar8 * 3));
            if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
              operator_delete((void *)local_470._0_8_);
            }
            iVar20 = iVar20 + 1;
            bVar22 = 2;
          }
          else {
            if (bVar22 == 2) {
              lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320681,0);
              if ((lVar14 != 0) &&
                 (iVar8 = std::__cxx11::string::compare((char *)&local_4d8), iVar8 != 0)) {
                std::__cxx11::string::operator=((string *)&local_508,"wrong face definition");
                goto LAB_002be6ee;
              }
            }
            else if (bVar22 == 1) {
              lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x32052f,0);
              if (((lVar14 == 0) ||
                  (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320540,0), lVar14 == 0))
                 || (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320551,0), lVar14 == 0
                    )) {
                local_560 = (ulong)((int)local_560 + 1);
LAB_002beebe:
                bVar22 = 1;
              }
              else {
                lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320562,0);
                if (((lVar14 == 0) ||
                    (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320574,0), lVar14 == 0
                    )) || (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320586,0),
                          lVar14 == 0)) {
                  local_604 = local_604 + 1;
                  bVar22 = 1;
                  if (local_604 == 3) {
                    std::
                    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ::resize(&local_548,
                             ((long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555);
                  }
                }
                else {
                  lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320598,0);
                  if (((lVar14 == 0) ||
                      (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x3205a9,0),
                      lVar14 == 0)) ||
                     ((lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x3205ba,0),
                      lVar14 == 0 ||
                      (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x3205cb,0),
                      lVar14 == 0)))) {
                    local_608 = local_608 + 1;
                    std::
                    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                    ::resize(&local_528,
                             ((long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555);
                    bVar22 = 1;
                    local_600 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  else {
                    lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x3205dc,0);
                    if ((((lVar14 != 0) &&
                         (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x3205ef,0),
                         lVar14 != 0)) &&
                        (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320604,0),
                        lVar14 != 0)) &&
                       (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320618,0),
                       lVar14 != 0)) {
                      lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x32062d,0);
                      if ((lVar14 == 0) ||
                         (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x32063e,0),
                         lVar14 == 0)) {
                        std::
                        vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ::resize(&local_4b8,
                                 ((long)local_5f8.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_5f8.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x5555555555555555);
                      }
                      else {
                        lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x32064f,0);
                        if ((lVar14 != 0) &&
                           (lVar14 = std::__cxx11::string::find((char *)&local_4d8,0x320668,0),
                           lVar14 != 0)) goto LAB_002becc1;
                        std::
                        vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ::resize(&local_4b8,
                                 ((long)local_5f8.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_5f8.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x5555555555555555);
                      }
                      local_5fc = local_5fc + 1;
                      goto LAB_002beebe;
                    }
                    local_608 = local_608 + 1;
                    std::
                    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                    ::resize(&local_528,
                             ((long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_5f8.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555);
                    bVar22 = 1;
                    local_600 = 0;
                  }
                }
              }
              goto LAB_002bf31b;
            }
LAB_002becc1:
            iVar8 = std::__cxx11::string::compare((char *)&local_4d8);
            if (iVar8 == 0) {
              if ((local_528.
                   super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish ==
                   local_528.
                   super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) || (0xfffffffd < local_608 - 5U)) {
                if ((local_548.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish ==
                     local_548.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) || (local_604 == 3)) {
                  if (local_5f8.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_5f8.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"ERROR glMesh, load(): mesh loaded from \"",
                               0x28);
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(local_4e0->_M_dataplus)._M_p,
                                         local_4e0->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,"\" has no vertices",0x11);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12)
                    ;
                    std::ostream::put((char)poVar12);
                    std::ostream::flush();
                  }
                  bVar23 = iVar21 == -1;
                  iVar21 = iVar9;
                  if (bVar23) {
                    iVar21 = 9999;
                  }
                  if (iVar20 == -1) {
                    iVar20 = 9999;
                  }
                  bVar22 = (iVar20 <= iVar21) * '\x02' + 3;
                  iVar9 = iVar21;
                  goto LAB_002bf31b;
                }
                toString<int>((string *)local_5b8,&local_604);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_5e0,
                               "data has normal coordiantes but not correct number of components. Found "
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5b8);
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_5e0);
              }
              else {
                toString<int>((string *)local_5b8,&local_608);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_5e0,
                               "data has color coordiantes but not correct number of components. Found "
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5b8);
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_5e0);
              }
              psVar18 = (size_type *)(plVar16 + 2);
              if ((size_type *)*plVar16 == psVar18) {
                local_470._16_8_ = *psVar18;
                local_470._24_8_ = plVar16[3];
                local_470._0_8_ = local_470 + 0x10;
              }
              else {
                local_470._16_8_ = *psVar18;
                local_470._0_8_ = (size_type *)*plVar16;
              }
              local_470._8_8_ = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_508,(string *)local_470);
              if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
                operator_delete((void *)local_470._0_8_);
              }
              if ((undefined1 *)CONCAT44(aStack_5dc,local_5e0) != local_5d0) {
                operator_delete((undefined1 *)CONCAT44(aStack_5dc,local_5e0));
              }
              if ((undefined1 *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != local_5a8) {
                operator_delete((undefined1 *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_));
              }
              goto LAB_002be6ee;
            }
            if (bVar22 == 5) {
              if (local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_470);
                std::__cxx11::stringbuf::str((string *)(local_470 + 0x18));
                std::istream::operator>>(local_470,(int *)&local_5e0);
                local_570 = CONCAT44(local_570._4_4_,local_5e0);
                if (local_5e0 == (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3
                   ) {
                  std::istream::operator>>(local_470,(int *)local_5b8);
                  lVar14 = (long)((int)local_578 * 3);
                  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14] = local_5b8._0_4_;
                  std::istream::operator>>(local_470,(int *)local_5b8);
                  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14 + 1] = local_5b8._0_4_;
                  std::istream::operator>>(local_470,(int *)local_5b8);
                  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14 + 2] = local_5b8._0_4_;
                  local_578 = (ulong)((int)local_578 + 1);
                  bVar22 = (iVar20 <= iVar21 ||
                           (ulong)((long)local_598.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_598.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 !=
                           local_578) * '\x02' + 3;
                }
                else {
                  bVar22 = 5;
                  std::__cxx11::string::_M_replace((ulong)&local_508,0,local_500,0x32079b);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_470);
                std::ios_base::~ios_base(local_4e8);
                if ((int)local_570 != 3) goto LAB_002be6ee;
              }
            }
            else if (bVar22 == 3) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_470);
              std::__cxx11::stringbuf::str((string *)(local_470 + 0x18));
              std::istream::_M_extract<float>((float *)local_470);
              std::istream::_M_extract<float>((float *)local_470);
              if (2 < (int)local_560) {
                std::istream::_M_extract<float>((float *)local_470);
              }
              lVar14 = (long)(int)local_568;
              local_5f8.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_2 =
                   (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_5b8._8_4_;
              local_5f8.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_5b8._0_4_;
              local_5f8.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_5b8._4_4_;
              local_570 = lVar14;
              if (0 < local_604) {
                std::istream::_M_extract<float>((float *)local_470);
                std::istream::_M_extract<float>((float *)local_470);
                std::istream::_M_extract<float>((float *)local_470);
                local_548.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14].field_2 = aStack_5d8;
                local_548.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14].field_0 =
                     (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_5e0;
                local_548.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14].field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aStack_5dc;
              }
              lVar14 = local_570;
              if (0 < local_608) {
                if ((local_600 & 1) == 0) {
                  local_5bc = 255.0;
                  std::istream::_M_extract<float>((float *)local_470);
                  std::istream::_M_extract<float>((float *)local_470);
                  std::istream::_M_extract<float>((float *)local_470);
                  if (3 < local_608) {
                    std::istream::_M_extract<float>((float *)local_470);
                  }
                  local_528.
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14].field_0.x = local_5e0.x / 255.0;
                  local_528.
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14].field_1.y = local_54c / 255.0;
                  local_528.
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14].field_2.z = local_550 / 255.0;
                  local_528.
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14].field_3.w = local_5bc / 255.0;
                }
                else {
                  std::istream::_M_extract<float>((float *)local_470);
                  std::istream::_M_extract<float>((float *)local_470);
                  std::istream::_M_extract<float>((float *)local_470);
                  if (3 < local_608) {
                    std::istream::_M_extract<float>((float *)local_470);
                  }
                  pvVar1 = local_528.
                           super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14;
                  pvVar1->field_0 =
                       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_5e0;
                  pvVar1->field_1 =
                       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)aStack_5dc;
                  pvVar1->field_2 =
                       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)aStack_5d8;
                  pvVar1->field_3 =
                       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_5d4;
                }
              }
              if (0 < local_5fc) {
                std::istream::_M_extract<float>((float *)local_470);
                std::istream::_M_extract<float>((float *)local_470);
                vVar4.field_1 = aStack_5dc;
                vVar4.field_0 = local_5e0;
                local_4b8.
                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14] = vVar4;
              }
              local_568 = (ulong)((int)local_568 + 1);
              bVar22 = (iVar21 < iVar20 &&
                       ((long)local_5f8.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_5f8.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555
                       - local_568 == 0) * '\x02' + 3;
              std::__cxx11::stringstream::~stringstream((stringstream *)local_470);
              std::ios_base::~ios_base(local_4e8);
            }
          }
        }
LAB_002bf31b:
        iVar7 = iVar7 + 1;
      }
      std::fstream::close();
      pSVar5 = local_478;
      pMVar3 = local_480;
      Mesh::addColors(&local_2e8,&local_528);
      Mesh::addVertices(&local_2e8,&local_5f8);
      Mesh::addTexCoords(&local_2e8,&local_4b8);
      if (local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_2e8.m_drawMode = POINTS;
      }
      else {
        Mesh::addIndices(&local_2e8,&local_598);
      }
      if (local_548.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_548.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        Mesh::computeNormals(&local_2e8);
      }
      else {
        Mesh::addNormals(&local_2e8,&local_548);
      }
      Mesh::computeTangents(&local_2e8);
      ppMVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](local_558,&pMVar3->name);
      *ppMVar11 = pMVar3;
      if (local_2e8.m_drawMode == LINES) {
        pcVar17 = "lines";
      }
      else if (local_2e8.m_drawMode == POINTS) {
        pcVar17 = "points";
      }
      else {
        pcVar17 = "mesh";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_4a0,0,(char *)local_4a0._M_string_length,(ulong)pcVar17);
      this_00 = (Model *)operator_new(0x2d8);
      Model::Model(this_00,&local_4a0,&local_2e8,pMVar3);
      ppMVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                 ::operator[](&pSVar5->models,&local_4a0);
      *ppMVar15 = this_00;
      bVar23 = false;
    }
    else {
      iVar7 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_508,0,local_500,0x3204b1);
LAB_002be6ee:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): ",0x16);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_508,(long)local_500);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): \"",0x17);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_4d8,local_4d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      bVar23 = true;
      std::ostream::flush();
    }
    if (local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b8.
        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b8.
                      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_548.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_548.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5f8.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5f8.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_528.
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_528.
                      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    if (local_508 != local_4f8) {
      operator_delete(local_508);
    }
    if (local_4d8 != local_4c8) {
      operator_delete(local_4d8);
    }
    Mesh::~Mesh(&local_2e8);
    bVar19 = true;
    if (!bVar23) goto LAB_002be905;
  }
  std::fstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR glMesh, can not load  ",0x1c);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(local_4e0->_M_dataplus)._M_p,
                       local_4e0->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  bVar19 = false;
LAB_002be905:
  std::fstream::~fstream(local_240);
  return bVar19;
}

Assistant:

bool loadPLY(const std::string& _filename, Scene* _scene, bool _verbose) {    
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* default_material = _scene->materials["default"];

        Mesh mesh;

        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        mesh.addColors(colors);
        mesh.addVertices(vertices);
        mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 ){
            mesh.addIndices( indices );
        }
        else {
            mesh.setDrawMode( POINTS );
        }
        
        if ( normals.size() > 0 ) {
            mesh.addNormals( normals );
        }
        else {
            mesh.computeNormals();
        }

        mesh.computeTangents();

        _scene->materials[default_material->name] = default_material;

        if (mesh.getDrawMode() == POINTS)
            name = "points";
        else if (mesh.getDrawMode() == LINES)
            name = "lines";
        else
            name = "mesh";
        _scene->models[name] = new Model(name, mesh, default_material);

        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}